

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * libdeflate_aligned_malloc(malloc_func_t malloc_func,size_t alignment,size_t size)

{
  void *pvVar1;
  long in_RDX;
  long in_RSI;
  code *in_RDI;
  void *orig_ptr;
  void *ptr;
  void *local_20;
  
  pvVar1 = (void *)(*in_RDI)(in_RSI + 7 + in_RDX);
  local_20 = pvVar1;
  if (pvVar1 != (void *)0x0) {
    local_20 = (void *)((long)pvVar1 + in_RSI + 7 & (in_RSI - 1U ^ 0xffffffffffffffff));
    *(void **)((long)local_20 - 8) = pvVar1;
  }
  return local_20;
}

Assistant:

void *
libdeflate_aligned_malloc(malloc_func_t malloc_func,
			  size_t alignment, size_t size)
{
	void *ptr = (*malloc_func)(sizeof(void *) + alignment - 1 + size);

	if (ptr) {
		void *orig_ptr = ptr;

		ptr = (void *)ALIGN((uintptr_t)ptr + sizeof(void *), alignment);
		((void **)ptr)[-1] = orig_ptr;
	}
	return ptr;
}